

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t
exr_register_attr_type_handler
          (exr_context_t ctxt,char *type,
          _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr
          *unpack_func_ptr,
          _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *pack_func_ptr,
          _func_void_exr_context_t_void_ptr_int32_t *destroy_unpacked_func_ptr)

{
  _internal_exr_part *p_Var1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  exr_attribute_t **out;
  exr_attribute_list_t *peVar6;
  double in_RCX;
  char *in_RDX;
  char *in_RSI;
  _internal_exr_context *in_RDI;
  uint8_t **in_R8;
  int a;
  int nattr;
  int p;
  _internal_exr_context *pctxt;
  exr_attribute_list_t *curattrs;
  size_t slen;
  int32_t mlen;
  int32_t tlen;
  exr_result_t rv;
  exr_attribute_t *ent;
  char *in_stack_ffffffffffffff88;
  int local_6c;
  int local_64;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc4;
  exr_const_context_t in_stack_ffffffffffffffc8;
  long lVar7;
  exr_attribute_t *peVar8;
  _internal_exr_context *list;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar9;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar9 = 2;
  }
  else {
    list = in_RDI;
    internal_exr_lock(in_RDI);
    uVar2 = (uint)in_RDI->max_name_length;
    if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
      internal_exr_unlock(in_RDI);
      eVar9 = (*in_RDI->report_error)(in_RDI,3,"Invalid type to register_attr_handler");
    }
    else {
      out = (exr_attribute_t **)strlen(in_RSI);
      if ((exr_attribute_t **)(long)(int)uVar2 < out) {
        internal_exr_unlock(in_RDI);
        eVar9 = (*in_RDI->print_error)
                          (in_RDI,0xc,"Provided type name \'%s\' too long for file (len %d, max %d)"
                           ,in_RSI,(ulong)out & 0xffffffff,(ulong)uVar2);
      }
      else {
        uVar3 = (uint)out;
        iVar4 = internal_exr_is_standard_type(in_stack_ffffffffffffff88);
        if (iVar4 == 0) {
          eVar9 = exr_attr_list_find_by_name
                            (in_stack_ffffffffffffffc8,
                             (exr_attribute_list_t *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),
                             (char *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),out);
          if (eVar9 == 0) {
            internal_exr_unlock(in_RDI);
            eVar9 = (*in_RDI->print_error)
                              (in_RDI,3,"Attribute handler for \'%s\' previously registered",in_RSI)
            ;
          }
          else {
            lVar7 = 0;
            eVar9 = exr_attr_list_add_by_type
                              ((exr_context_t)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                               (exr_attribute_list_t *)list,in_RSI,in_RDX,
                               (int32_t)((ulong)in_RCX >> 0x20),in_R8,_nattr);
            if (eVar9 == 0) {
              *(char **)(*(long *)(lVar7 + 0x18) + 0x20) = in_RDX;
              *(double *)(*(long *)(lVar7 + 0x18) + 0x28) = in_RCX;
              *(uint8_t ***)(*(long *)(lVar7 + 0x18) + 0x30) = in_R8;
              eVar9 = 0;
              for (local_64 = 0; local_64 < in_RDI->num_parts; local_64 = local_64 + 1) {
                p_Var1 = in_RDI->parts[local_64];
                peVar6 = &p_Var1->attributes;
                if (peVar6 != (exr_attribute_list_t *)0x0) {
                  iVar4 = peVar6->num_attributes;
                  for (local_6c = 0; local_6c < iVar4; local_6c = local_6c + 1) {
                    peVar8 = (p_Var1->attributes).entries[local_6c];
                    if ((peVar8->type_name_length == uVar3) &&
                       (iVar5 = strcmp(peVar8->type_name,in_RSI), iVar5 == 0)) {
                      ((peVar8->field_6).m33d)->m[4] = (double)in_RDX;
                      ((peVar8->field_6).m33d)->m[5] = in_RCX;
                      ((peVar8->field_6).m33d)->m[6] = (double)in_R8;
                    }
                  }
                }
              }
              internal_exr_unlock(in_RDI);
            }
            else {
              internal_exr_unlock(in_RDI);
              eVar9 = (*in_RDI->print_error)
                                (in_RDI,eVar9,"Unable to register custom handler for type \'%s\'",
                                 in_RSI);
            }
          }
        }
        else {
          internal_exr_unlock(in_RDI);
          eVar9 = (*in_RDI->print_error)
                            (in_RDI,3,"Provided type name \'%s\' is a reserved / internal type name"
                             ,in_RSI);
        }
      }
    }
  }
  return eVar9;
}

Assistant:

exr_result_t
exr_register_attr_type_handler (
    exr_context_t ctxt,
    const char*   type,
    exr_result_t (*unpack_func_ptr) (
        exr_context_t ctxt,
        const void*   data,
        int32_t       attrsize,
        int32_t*      outsize,
        void**        outbuffer),
    exr_result_t (*pack_func_ptr) (
        exr_context_t ctxt,
        const void*   data,
        int32_t       datasize,
        int32_t*      outsize,
        void*         outbuffer),
    void (*destroy_unpacked_func_ptr) (
        exr_context_t ctxt, void* data, int32_t datasize))
{
    exr_attribute_t*      ent;
    exr_result_t          rv;
    int32_t               tlen, mlen = EXR_SHORTNAME_MAXLEN;
    size_t                slen;
    exr_attribute_list_t* curattrs;

    EXR_PROMOTE_LOCKED_CONTEXT_OR_ERROR (ctxt);

    mlen = (int32_t) pctxt->max_name_length;

    if (!type || type[0] == '\0')
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid type to register_attr_handler"));

    slen = strlen (type);
    if (slen > (size_t) mlen)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided type name '%s' too long for file (len %d, max %d)",
            type,
            (int) slen,
            mlen));
    tlen = (int32_t) slen;

    if (internal_exr_is_standard_type (type))
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Provided type name '%s' is a reserved / internal type name",
            type));

    rv = exr_attr_list_find_by_name (
        ctxt, &(pctxt->custom_handlers), type, &ent);
    if (rv == EXR_ERR_SUCCESS)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attribute handler for '%s' previously registered",
            type));

    ent = NULL;
    rv  = exr_attr_list_add_by_type (
        ctxt, &(pctxt->custom_handlers), type, type, 0, NULL, &ent);
    if (rv != EXR_ERR_SUCCESS)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            rv,
            "Unable to register custom handler for type '%s'",
            type));

    ent->opaque->unpack_func_ptr           = unpack_func_ptr;
    ent->opaque->pack_func_ptr             = pack_func_ptr;
    ent->opaque->destroy_unpacked_func_ptr = destroy_unpacked_func_ptr;

    for (int p = 0; p < pctxt->num_parts; ++p)
    {
        curattrs = &(pctxt->parts[p]->attributes);
        if (curattrs)
        {
            int nattr = curattrs->num_attributes;
            for (int a = 0; a < nattr; ++a)
            {
                ent = curattrs->entries[a];
                if (ent->type_name_length == tlen &&
                    0 == strcmp (ent->type_name, type))
                {
                    ent->opaque->unpack_func_ptr = unpack_func_ptr;
                    ent->opaque->pack_func_ptr   = pack_func_ptr;
                    ent->opaque->destroy_unpacked_func_ptr =
                        destroy_unpacked_func_ptr;
                }
            }
        }
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}